

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O2

void ccp_key(ssh_cipher *cipher,void *vkey)

{
  chacha20_key((chacha20 *)(cipher + -0x31),(uchar *)((long)vkey + 0x20));
  chacha20_key((chacha20 *)((long)&cipher[-0x21].vt + 4),(uchar *)vkey);
  return;
}

Assistant:

static void ccp_key(ssh_cipher *cipher, const void *vkey)
{
    const unsigned char *key = (const unsigned char *)vkey;
    struct ccp_context *ctx = container_of(cipher, struct ccp_context, ciph);
    /* Initialise the a_cipher (for decrypting lengths) with the first 256 bits */
    chacha20_key(&ctx->a_cipher, key + 32);
    /* Initialise the b_cipher (for content and MAC) with the second 256 bits */
    chacha20_key(&ctx->b_cipher, key);
}